

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytecode_machine.cpp
# Opt level: O0

void randomx::BytecodeMachine::executeInstruction
               (InstructionByteCode *ibc,int *pc,uint8_t *scratchpad,ProgramConfiguration *config)

{
  long in_RDI;
  
  (*(code *)(&DAT_00157a28 + *(int *)(&DAT_00157a28 + (ulong)*(ushort *)(in_RDI + 0x18) * 4)))();
  return;
}

Assistant:

void BytecodeMachine::executeInstruction(RANDOMX_EXE_ARGS) {
		switch (ibc.type)
		{
			INSTR_CASE(IADD_RS)
			INSTR_CASE(IADD_M)
			INSTR_CASE(ISUB_R)
			INSTR_CASE(ISUB_M)
			INSTR_CASE(IMUL_R)
			INSTR_CASE(IMUL_M)
			INSTR_CASE(IMULH_R)
			INSTR_CASE(IMULH_M)
			INSTR_CASE(ISMULH_R)
			INSTR_CASE(ISMULH_M)
			INSTR_CASE(INEG_R)
			INSTR_CASE(IXOR_R)
			INSTR_CASE(IXOR_M)
			INSTR_CASE(IROR_R)
			INSTR_CASE(IROL_R)
			INSTR_CASE(ISWAP_R)
			INSTR_CASE(FSWAP_R)
			INSTR_CASE(FADD_R)
			INSTR_CASE(FADD_M)
			INSTR_CASE(FSUB_R)
			INSTR_CASE(FSUB_M)
			INSTR_CASE(FSCAL_R)
			INSTR_CASE(FMUL_R)
			INSTR_CASE(FDIV_M)
			INSTR_CASE(FSQRT_R)
			INSTR_CASE(CBRANCH)
			INSTR_CASE(CFROUND)
			INSTR_CASE(ISTORE)

		case InstructionType::NOP:
			break;

		case InstructionType::IMUL_RCP: //executed as IMUL_R
		default:
			UNREACHABLE;
		}
	}